

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresstype.cpp
# Opt level: O2

CScript * __thiscall
anon_unknown.dwarf_b0b0f1::CScriptVisitor::operator()
          (CScript *__return_storage_ptr__,CScriptVisitor *this,WitnessUnknown *id)

{
  opcodetype opcode;
  CScript *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  long in_FS_OFFSET;
  undefined1 local_48 [40];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = 0;
  local_48._24_8_ = 0;
  local_48._0_8_ = (char *)0x0;
  local_48._8_8_ = 0;
  opcode = CScript::EncodeOP_N(*(int *)this);
  this_00 = CScript::operator<<((CScript *)local_48,opcode);
  other = &CScript::operator<<(this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       (this + 8))->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&__return_storage_ptr__->super_CScriptBase,other);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CScript operator()(const WitnessUnknown& id) const
    {
        return CScript() << CScript::EncodeOP_N(id.GetWitnessVersion()) << id.GetWitnessProgram();
    }